

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfedge.cpp
# Opt level: O0

vector<long,_std::allocator<long>_> * __thiscall
graphics101::HalfEdgeTriMesh::boundary_vertices
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,HalfEdgeTriMesh *this)

{
  bool bVar1;
  HalfEdge *__x;
  pair<std::__detail::_Node_iterator<long,_true,_false>,_bool> pVar2;
  allocator<long> local_b1;
  _Node_iterator_base<long,_false> local_b0;
  _Node_iterator_base<long,_false> local_a8;
  _Node_iterator_base<long,_false> local_a0;
  undefined1 local_98;
  _Node_iterator_base<long,_false> local_90;
  undefined1 local_88;
  reference local_70;
  HalfEdge *he;
  const_iterator __end1;
  const_iterator __begin1;
  vector<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
  *__range1;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> result;
  HalfEdgeTriMesh *this_local;
  
  result._M_h._M_single_bucket = (__node_base_ptr)this;
  std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  unordered_set((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *)
                &__range1);
  __end1 = std::
           vector<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
           ::begin(&this->m_halfedges);
  he = (HalfEdge *)
       std::
       vector<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
       ::end(&this->m_halfedges);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_graphics101::HalfEdgeTriMesh::HalfEdge_*,_std::vector<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>_>
                                *)&he);
    if (!bVar1) break;
    local_70 = __gnu_cxx::
               __normal_iterator<const_graphics101::HalfEdgeTriMesh::HalfEdge_*,_std::vector<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>_>
               ::operator*(&__end1);
    if (local_70->face == -1) {
      pVar2 = std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
              ::insert((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                        *)&__range1,&local_70->to_vertex);
      local_90._M_cur = (__node_type *)pVar2.first.super__Node_iterator_base<long,_false>._M_cur;
      local_88 = pVar2.second;
      __x = halfedge(this,&local_70->opposite_he);
      pVar2 = std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
              ::insert((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                        *)&__range1,&__x->to_vertex);
      local_a0._M_cur = (__node_type *)pVar2.first.super__Node_iterator_base<long,_false>._M_cur;
      local_98 = pVar2.second;
    }
    __gnu_cxx::
    __normal_iterator<const_graphics101::HalfEdgeTriMesh::HalfEdge_*,_std::vector<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>_>
    ::operator++(&__end1);
  }
  local_a8._M_cur =
       (__node_type *)
       std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::begin
                 ((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                   *)&__range1);
  local_b0._M_cur =
       (__node_type *)
       std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::end
                 ((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                   *)&__range1);
  std::allocator<long>::allocator(&local_b1);
  std::vector<long,std::allocator<long>>::
  vector<std::__detail::_Node_iterator<long,true,false>,void>
            ((vector<long,std::allocator<long>> *)__return_storage_ptr__,
             (_Node_iterator<long,_true,_false>)local_a8._M_cur,
             (_Node_iterator<long,_true,_false>)local_b0._M_cur,&local_b1);
  std::allocator<long>::~allocator(&local_b1);
  std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  ~unordered_set((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *
                 )&__range1);
  return __return_storage_ptr__;
}

Assistant:

std::vector< HalfEdgeTriMesh::Index > HalfEdgeTriMesh::boundary_vertices() const
{
    // Use an std::set<> if we wanted the returned sequence to be sorted.
    std::unordered_set< Index > result;
    for( const HalfEdge& he : m_halfedges )
    {
        if( -1 == he.face )
        {
            // result.extend( self.he_index2directed_edge( hei ) )
            result.insert( he.to_vertex );
            result.insert( halfedge( he.opposite_he ).to_vertex );
        }
    }

    return Indices( result.begin(), result.end() );
}